

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

int GetWitnessCommitmentIndex(CBlock *block)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  uchar *puVar5;
  long in_FS_OFFSET;
  CTxOut *vout;
  size_t o;
  int commitpos;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  size_type __n;
  size_type pos;
  const_reference in_stack_ffffffffffffffd8;
  size_type local_20;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = -1;
  bVar2 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::empty((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)in_stack_ffffffffffffffd8);
  if (!bVar2) {
    local_20 = 0;
    while( true ) {
      __n = local_20;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_ffffffffffffffd8,local_20);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      sVar4 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (sVar4 <= __n) break;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_ffffffffffffffd8,__n);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      in_stack_ffffffffffffffd8 =
           std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffffd8,__n);
      pos = (size_type)(__n >> 0x20);
      sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         in_stack_ffffffffffffffd8);
      if ((((0x25 < sVar3) &&
           (puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                               ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                in_stack_ffffffffffffffd8,pos), *puVar5 == 'j')) &&
          (puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               in_stack_ffffffffffffffd8,pos), *puVar5 == '$')) &&
         (((puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                               ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                in_stack_ffffffffffffffd8,pos), *puVar5 == 0xaa &&
           (puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                               ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                in_stack_ffffffffffffffd8,pos), *puVar5 == '!')) &&
          ((puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                               ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                in_stack_ffffffffffffffd8,pos), *puVar5 == 0xa9 &&
           (puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                               ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                in_stack_ffffffffffffffd8,pos), *puVar5 == 0xed)))))) {
        local_14 = (int)local_20;
      }
      local_20 = local_20 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

inline int GetWitnessCommitmentIndex(const CBlock& block)
{
    int commitpos = NO_WITNESS_COMMITMENT;
    if (!block.vtx.empty()) {
        for (size_t o = 0; o < block.vtx[0]->vout.size(); o++) {
            const CTxOut& vout = block.vtx[0]->vout[o];
            if (vout.scriptPubKey.size() >= MINIMUM_WITNESS_COMMITMENT &&
                vout.scriptPubKey[0] == OP_RETURN &&
                vout.scriptPubKey[1] == 0x24 &&
                vout.scriptPubKey[2] == 0xaa &&
                vout.scriptPubKey[3] == 0x21 &&
                vout.scriptPubKey[4] == 0xa9 &&
                vout.scriptPubKey[5] == 0xed) {
                commitpos = o;
            }
        }
    }
    return commitpos;
}